

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O2

void query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
               (kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
                *tree)

{
  ostream *poVar1;
  neighbor<int,_float> nn;
  float query [3];
  neighbor_type local_20;
  float local_18 [4];
  
  local_18[0] = 4.0;
  local_18[1] = 4.0;
  local_18[2] = 4.0;
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::search_nn<float[3]>(tree,(float (*) [3])local_18,&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Index closest point: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20.index);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void query_tree(Tree_ const& tree) {
  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;
}